

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenUnpackVal
          (string *__return_storage_ptr__,CppGenerator *this,Type *type,string *val,bool invector,
          FieldDef *afield)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BaseType BVar3;
  StructDef *pSVar4;
  pointer pcVar5;
  string *psVar6;
  bool bVar7;
  long *plVar8;
  const_iterator cVar9;
  undefined8 *puVar10;
  size_type *psVar11;
  _Rb_tree_header *p_Var12;
  long lVar13;
  char *pcVar14;
  _Alloc_hider vec_type_access;
  string name;
  string ptype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_108;
  string *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string *local_80;
  string local_78;
  SymbolTable<flatbuffers::Value> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  BVar3 = type->base_type;
  local_e8 = __return_storage_ptr__;
  if (BVar3 == BASE_TYPE_UNION) {
    pcVar14 = "->Get(_i)";
    if (invector) {
      std::operator+(&local_e0,"->GetEnum<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     type->enum_def);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_108.field_2._M_allocated_capacity = *psVar11;
        local_108.field_2._8_8_ = plVar8[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar11;
        local_108._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_108._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      vec_type_access._M_p = local_108._M_dataplus._M_p;
    }
    else {
      pcVar14 = "";
      vec_type_access._M_p =
           (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x36bc82;
    }
    GenUnionUnpackVal_abi_cxx11_(__return_storage_ptr__,this,afield,pcVar14,vec_type_access._M_p);
    if (!invector) {
      return local_e8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_0019d6b7:
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (BVar3 != BASE_TYPE_STRUCT) {
      if (BVar3 != BASE_TYPE_STRING) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = (val->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar5,pcVar5 + val->_M_string_length);
        return __return_storage_ptr__;
      }
      bVar7 = FlexibleStringConstructor(this,afield);
      if (!bVar7) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar5 = (val->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,pcVar5,pcVar5 + val->_M_string_length);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        return local_e8;
      }
      NativeString_abi_cxx11_(&local_78,this,afield);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::string::append((char *)&local_a0);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_a0,(ulong)(val->_M_dataplus)._M_p);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_c0.field_2._M_allocated_capacity = *psVar11;
        local_c0.field_2._8_8_ = plVar8[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar11;
        local_c0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_c0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e0.field_2._M_allocated_capacity = *psVar11;
        local_e0.field_2._8_8_ = puVar10[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar11;
        local_e0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_e0._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_e0,(ulong)(val->_M_dataplus)._M_p);
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_108.field_2._M_allocated_capacity = *psVar11;
        local_108.field_2._8_8_ = puVar10[3];
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar11;
        local_108._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_108._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_108);
      (local_e8->_M_dataplus)._M_p = (pointer)&local_e8->field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        lVar13 = plVar8[3];
        (local_e8->field_2)._M_allocated_capacity = *psVar11;
        *(long *)((long)&local_e8->field_2 + 8) = lVar13;
      }
      else {
        (local_e8->_M_dataplus)._M_p = (pointer)*plVar8;
        (local_e8->field_2)._M_allocated_capacity = *psVar11;
      }
      local_e8->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return local_e8;
      }
      goto LAB_0019d9e3;
    }
    pSVar4 = type->struct_def;
    if (pSVar4->fixed != true) {
      pcVar14 = "";
      if ((ulong)afield->native_inline != 0) {
        pcVar14 = "*";
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,pcVar14,pcVar14 + afield->native_inline);
      WrapNativeNameInNameSpace_abi_cxx11_
                (&local_c0,this,type->struct_def,&(this->opts_).super_IDLOptions);
      psVar6 = local_e8;
      GenTypeNativePtr(&local_e0,this,&local_c0,afield,true);
      std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e0._M_dataplus._M_p);
      paVar1 = &local_e0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_c0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,local_108._M_dataplus._M_p,
                 local_108._M_dataplus._M_p + local_108._M_string_length);
      std::__cxx11::string::append((char *)&local_c0);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_c0,(ulong)(val->_M_dataplus)._M_p);
      psVar11 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_e0.field_2._M_allocated_capacity = *psVar11;
        local_e0.field_2._8_8_ = puVar10[3];
        local_e0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar11;
        local_e0._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_e0._M_string_length = puVar10[1];
      *puVar10 = psVar11;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_e0);
      (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
      psVar11 = (size_type *)(plVar8 + 2);
      if ((size_type *)*plVar8 == psVar11) {
        lVar13 = plVar8[3];
        (psVar6->field_2)._M_allocated_capacity = *psVar11;
        *(long *)((long)&psVar6->field_2 + 8) = lVar13;
      }
      else {
        (psVar6->_M_dataplus)._M_p = (pointer)*plVar8;
        (psVar6->field_2)._M_allocated_capacity = *psVar11;
      }
      psVar6->_M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      local_78.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return local_e8;
      }
      goto LAB_0019d9e3;
    }
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"native_type","");
    local_58 = &(pSVar4->super_Definition).attributes;
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)local_58,&local_108);
    p_Var12 = &(pSVar4->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar9._M_node == p_Var12) {
      bVar7 = true;
    }
    else {
      bVar7 = *(long *)(cVar9._M_node + 2) == 0;
    }
    local_80 = val;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    psVar6 = local_80;
    if (bVar7) {
      if ((invector) || (afield->native_inline == true)) {
        std::operator+(local_e8,"*",local_80);
        return local_e8;
      }
      pSVar4 = type->struct_def;
      paVar1 = &local_e0.field_2;
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
      BaseGenerator::WrapInNameSpace
                (&local_108,&this->super_BaseGenerator,&pSVar4->super_Definition,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      GenTypeNativePtr(&local_e0,this,&local_108,afield,true);
      std::operator+(&local_50,&local_e0,"(new ");
      std::operator+(&local_78,&local_50,&local_108);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_78);
      psVar11 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_a0.field_2._M_allocated_capacity = *psVar11;
        local_a0.field_2._8_8_ = plVar8[3];
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      }
      else {
        local_a0.field_2._M_allocated_capacity = *psVar11;
        local_a0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_a0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::operator+(&local_c0,&local_a0,psVar6);
      std::operator+(local_e8,&local_c0,"))");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      local_78.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return local_e8;
      }
      goto LAB_0019d9e3;
    }
    (local_e8->_M_dataplus)._M_p = (pointer)&local_e8->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"::flatbuffers::UnPack","");
    paVar1 = &local_108.field_2;
    local_108._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"native_type_pack_name","")
    ;
    psVar6 = local_80;
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)local_58,&local_108);
    if ((_Rb_tree_header *)cVar9._M_node == p_Var12) {
      lVar13 = 0;
    }
    else {
      lVar13 = *(long *)(cVar9._M_node + 2);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (lVar13 != 0) {
      std::__cxx11::string::_M_append((char *)local_e8,*(ulong *)(lVar13 + 0x20));
    }
    std::operator+(&local_e0,"(*",psVar6);
    psVar6 = local_e8;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
    psVar11 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108.field_2._8_8_ = puVar10[3];
      local_108._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar11;
      local_108._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_108._M_string_length = puVar10[1];
    *puVar10 = psVar11;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)psVar6,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) goto LAB_0019d6b7;
  }
  local_78.field_2._M_allocated_capacity = local_e0.field_2._M_allocated_capacity;
  local_78._M_dataplus._M_p = local_e0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
    return local_e8;
  }
LAB_0019d9e3:
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  return local_e8;
}

Assistant:

std::string GenUnpackVal(const Type &type, const std::string &val,
                           bool invector, const FieldDef &afield) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: {
        if (FlexibleStringConstructor(&afield)) {
          return NativeString(&afield) + "(" + val + "->c_str(), " + val +
                 "->size())";
        } else {
          return val + "->str()";
        }
      }
      case BASE_TYPE_STRUCT: {
        if (IsStruct(type)) {
          const auto &struct_attrs = type.struct_def->attributes;
          const auto native_type = struct_attrs.Lookup("native_type");
          if (native_type) {
            std::string unpack_call = "::flatbuffers::UnPack";
            const auto pack_name = struct_attrs.Lookup("native_type_pack_name");
            if (pack_name) { unpack_call += pack_name->constant; }
            unpack_call += "(*" + val + ")";
            return unpack_call;
          } else if (invector || afield.native_inline) {
            return "*" + val;
          } else {
            const auto name = WrapInNameSpace(*type.struct_def);
            const auto ptype = GenTypeNativePtr(name, &afield, true);
            return ptype + "(new " + name + "(*" + val + "))";
          }
        } else {
          std::string ptype = afield.native_inline ? "*" : "";
          ptype += GenTypeNativePtr(
              WrapNativeNameInNameSpace(*type.struct_def, opts_), &afield,
              true);
          return ptype + "(" + val + "->UnPack(_resolver))";
        }
      }
      case BASE_TYPE_UNION: {
        return GenUnionUnpackVal(
            afield, invector ? "->Get(_i)" : "",
            invector ? ("->GetEnum<" + type.enum_def->name + ">(_i)").c_str()
                     : "");
      }
      default: {
        return val;
        break;
      }
    }
  }